

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_pack.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StructPackStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  reference new_stats;
  size_type __n;
  BaseStatistics struct_stats;
  LogicalType LStack_98;
  BaseStatistics local_80;
  
  this_00 = input->child_stats;
  LogicalType::LogicalType(&LStack_98,&(input->expr->super_Expression).return_type);
  StructStats::CreateUnknown(&local_80,&LStack_98);
  LogicalType::~LogicalType(&LStack_98);
  if ((this_00->super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>).
      super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this_00->super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>).
      super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      new_stats = vector<duckdb::BaseStatistics,_true>::operator[](this_00,__n);
      StructStats::SetChildStats(&local_80,__n,new_stats);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this_00->
                                  super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ).
                                  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->
                                  super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ).
                                  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x2e8ba2e8ba2e8ba3));
  }
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&local_80);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StructPackStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	auto struct_stats = StructStats::CreateUnknown(expr.return_type);
	for (idx_t i = 0; i < child_stats.size(); i++) {
		StructStats::SetChildStats(struct_stats, i, child_stats[i]);
	}
	return struct_stats.ToUnique();
}